

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall
FxMemberFunctionCall::Resolve(FxMemberFunctionCall *this,FCompileContext *ctx)

{
  FScriptPosition *pFVar1;
  long *plVar2;
  uint uVar3;
  Variant *pVVar4;
  PType *this_00;
  bool bVar5;
  int iVar6;
  PStruct *pPVar7;
  undefined4 extraout_var;
  PFunction *callee;
  PClass *pPVar9;
  PClass *pPVar10;
  PPointer *pPVar11;
  FxVMFunctionCall *this_01;
  undefined4 extraout_var_00;
  FxVectorBuiltin *this_02;
  undefined4 extraout_var_01;
  FxAssign *this_03;
  FxConstant *pFVar12;
  undefined4 extraout_var_02;
  char *pcVar13;
  long lVar14;
  char *message;
  char *pcVar15;
  undefined4 uVar16;
  undefined8 unaff_RBP;
  PStruct *pPVar17;
  undefined4 uVar18;
  undefined8 unaff_R13;
  bool writable;
  bool error;
  undefined4 local_50;
  undefined4 local_4c;
  FArgumentList *local_48;
  FName local_3c;
  FName local_38;
  FName local_34;
  FxExpression *pFVar8;
  
  if (ctx->Class == (PStruct *)0x0) {
LAB_005159f6:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  lVar14 = 0;
LAB_005158f6:
  if ((ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count << 3 != lVar14)
  goto code_r0x005158fb;
  pFVar8 = this->Self;
  if (pFVar8->ExprType == EFX_Identifier) {
    local_34.Index = *(int *)&pFVar8[1]._vptr_FxExpression;
    pPVar7 = FindStructType(&local_34);
    pFVar8 = this->Self;
    if (pPVar7 == (PStruct *)0x0) {
      if (pFVar8 != (FxExpression *)0x0) goto LAB_00515957;
      goto LAB_005159f6;
    }
    *(undefined1 *)((long)&pFVar8[1]._vptr_FxExpression + 4) = 1;
  }
  else {
LAB_00515957:
    pPVar7 = (PStruct *)0x0;
  }
  pPVar9 = (PClass *)ctx;
  iVar6 = (*pFVar8->_vptr_FxExpression[2])();
  pFVar8 = (FxExpression *)CONCAT44(extraout_var,iVar6);
  this->Self = pFVar8;
  if (pFVar8 == (FxExpression *)0x0) goto LAB_005159f6;
  if ((pPVar7 != (PStruct *)0x0) && (pFVar8->ValueType == &TypeError->super_PType)) {
    pPVar9 = PClass::RegistrationInfo.MyClass;
    bVar5 = DObject::IsKindOf((DObject *)pPVar7,PClass::RegistrationInfo.MyClass);
    uVar18 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    if ((bVar5) &&
       (*(char *)((long)&pPVar7[1].super_PNamedType.super_PCompoundType.super_PType.HashNext + 1) ==
        '\0')) {
      pFVar8 = this->Self;
      goto LAB_00515aa1;
    }
    uVar16 = 0;
    goto LAB_005159b7;
  }
LAB_00515aa1:
  if (pFVar8->ExprType == EFX_Super) {
    pPVar10 = dyn_cast<PClass>((DObject *)((ctx->Function->Variants).Array)->SelfClass);
    if (pPVar10 == (PClass *)0x0) {
      uVar16 = 0;
      pPVar9 = (PClass *)0x2;
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Super requires a class type");
      pFVar8 = this->Self;
    }
    else {
      pPVar9 = (PClass *)0x0;
      pPVar11 = NewPointer((PType *)pPVar10->ParentClass,false);
      pFVar8 = this->Self;
      pFVar8->ValueType = (PType *)pPVar11;
      pFVar8->ExprType = EFX_Self;
      uVar16 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    }
  }
  else {
    uVar16 = 0;
  }
  pPVar17 = TypeStringStruct;
  pPVar7 = (PStruct *)pFVar8->ValueType;
  if ((pPVar7 == (PStruct *)TypeTextureID) && (uVar3 = (this->MethodName).Index, uVar3 - 0x27f < 5))
  {
    if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count != 0) goto LAB_00515bb3;
    pFVar8->ValueType = (PType *)TypeSInt32;
    pFVar1 = &(this->super_FxExpression).ScriptPosition;
    switch(uVar3) {
    case 0x27f:
      this_03 = (FxAssign *)FxExpression::operator_new((FxExpression *)0x48,(size_t)pPVar9);
      pFVar8 = this->Self;
      pFVar12 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar9);
      FxConstant::FxConstant(pFVar12,0,pFVar1);
      iVar6 = 0x3e;
      break;
    case 0x280:
      this_03 = (FxAssign *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pPVar9);
      pFVar8 = this->Self;
      pFVar12 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar9);
      FxConstant::FxConstant(pFVar12,0,pFVar1);
      FxCompareEq::FxCompareEq((FxCompareEq *)this_03,0x11f,pFVar8,(FxExpression *)pFVar12);
      goto LAB_00515fb5;
    case 0x281:
      this_03 = (FxAssign *)FxExpression::operator_new((FxExpression *)0x48,(size_t)pPVar9);
      pFVar8 = this->Self;
      pFVar12 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar9);
      FxConstant::FxConstant(pFVar12,0,pFVar1);
      iVar6 = 0x11e;
      break;
    case 0x282:
      this_03 = (FxAssign *)FxExpression::operator_new((FxExpression *)0x48,(size_t)pPVar9);
      pFVar8 = this->Self;
      pFVar12 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar9);
      iVar6 = -1;
      goto LAB_00515f61;
    case 0x283:
      this_03 = (FxAssign *)FxExpression::operator_new((FxExpression *)0x48,(size_t)pPVar9);
      pFVar8 = this->Self;
      pFVar12 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar9);
      iVar6 = 0;
LAB_00515f61:
      FxConstant::FxConstant(pFVar12,iVar6,pFVar1);
      FxAssign::FxAssign(this_03,pFVar8,&pFVar12->super_FxExpression,false);
      goto LAB_00515fb5;
    }
    FxCompareRel::FxCompareRel((FxCompareRel *)this_03,iVar6,pFVar8,&pFVar12->super_FxExpression);
LAB_00515fb5:
    this->Self = (FxExpression *)0x0;
    iVar6 = (*(((FxBinary *)&this_03->super_FxExpression)->super_FxExpression)._vptr_FxExpression[2]
            )(this_03,ctx);
    pFVar8 = (FxExpression *)CONCAT44(extraout_var_02,iVar6);
    if (pFVar8 == (FxExpression *)0x0) goto LAB_005159f6;
    if (((this->MethodName).Index & 0xfffffffeU) == 0x282) {
      pFVar8->ValueType = &TypeVoid->super_PType;
    }
    goto LAB_00515d20;
  }
  if (((pPVar7 == TypeVector2) || (pPVar7 == TypeVector3)) &&
     (uVar3 = (this->MethodName).Index, uVar3 - 0x279 < 2)) {
    if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
      this_02 = (FxVectorBuiltin *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar9);
      local_38.Index = (this->MethodName).Index;
      FxVectorBuiltin::FxVectorBuiltin(this_02,this->Self,&local_38);
      this->Self = (FxExpression *)0x0;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
LAB_00515e91:
      iVar6 = (*(this_02->super_FxExpression)._vptr_FxExpression[2])(this_02,ctx);
      return (FxExpression *)CONCAT44(extraout_var_01,iVar6);
    }
LAB_00515bb3:
    pcVar13 = FName::NameData.NameArray[uVar3].Text;
LAB_00515bca:
    pcVar15 = "too many parameters in call to %s";
  }
  else {
    if (pPVar7 == (PStruct *)TypeString) {
      pFVar8->ValueType = (PType *)TypeStringStruct;
      pPVar7 = pPVar17;
    }
    bVar5 = DObject::IsKindOf((DObject *)pPVar7,PPointer::RegistrationInfo.MyClass);
    this_00 = this->Self->ValueType;
    if (bVar5) {
      pPVar7 = (PStruct *)this_00[1].super_PTypeBase.super_DObject._vptr_DObject;
      bVar5 = DObject::IsKindOf((DObject *)pPVar7,PStruct::RegistrationInfo.MyClass);
      if (bVar5) {
        pPVar9 = PClass::RegistrationInfo.MyClass;
        bVar5 = DObject::IsKindOf((DObject *)pPVar7,PClass::RegistrationInfo.MyClass);
        uVar18 = 0;
        if ((!bVar5) || ((this->MethodName).Index != 0xd6)) goto LAB_005159b7;
        if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
          this_02 = (FxVectorBuiltin *)
                    FxExpression::operator_new((FxExpression *)0x30,(size_t)pPVar9);
          FxGetClass::FxGetClass((FxGetClass *)this_02,this->Self);
          goto LAB_00515e91;
        }
        pcVar13 = FName::NameData.NameArray[0xd6].Text;
        goto LAB_00515bca;
      }
      pcVar13 = FName::NameData.NameArray[(this->MethodName).Index].Text;
      pcVar15 = "Left hand side of %s must point to a class object\n";
    }
    else {
      bVar5 = DObject::IsKindOf((DObject *)this_00,PStruct::RegistrationInfo.MyClass);
      if (((bVar5) &&
          (iVar6 = (*this->Self->_vptr_FxExpression[4])(this->Self,ctx,&writable),
          (char)iVar6 != '\0')) && (writable == true)) {
        pPVar7 = (PStruct *)this->Self->ValueType;
        uVar18 = 0;
        pPVar11 = NewPointer((PType *)pPVar7,false);
        this->Self->ValueType = (PType *)pPVar11;
LAB_005159b7:
        error = false;
        pPVar17 = ctx->Class;
        local_3c.Index = (this->MethodName).Index;
        pFVar1 = &(this->super_FxExpression).ScriptPosition;
        local_50 = uVar18;
        local_4c = uVar16;
        local_48 = &this->ArgList;
        callee = FindClassMemberFunction(pPVar7,pPVar17,&local_3c,pFVar1,&error);
        if (error == true) goto LAB_005159f6;
        if (callee != (PFunction *)0x0) {
          pVVar4 = (callee->Variants).Array;
          uVar3 = pVVar4->Flags;
          if ((byte)local_50 == '\0') {
            if ((uVar3 & 2) != 0) {
              pFVar8 = this->Self;
              if (pFVar8->ExprType != EFX_Self) {
                if ((pVVar4->UseFlags & 1) != 0) goto LAB_00515d70;
                pcVar13 = FName::NameData.NameArray
                          [*(int *)&(callee->super_PSymbol).super_PTypeBase.super_DObject.field_0x24
                          ].Text;
                pcVar15 = "Function %s cannot be used with a non-self object\n";
                goto LAB_00515d19;
              }
              pPVar17 = (PStruct *)ctx->Function;
              bVar5 = CheckFunctionCompatiblity(pFVar1,(PFunction *)pPVar17,callee);
              if (!bVar5) goto LAB_005159f6;
              if ((((callee->Variants).Array)->Flags & 2) != 0) {
                pFVar8 = this->Self;
                goto LAB_00515d70;
              }
            }
          }
          else if ((uVar3 & 2) != 0) {
            pPVar9 = dyn_cast<PClass>((DObject *)ctx->Class);
            pPVar10 = dyn_cast<PClass>((DObject *)pPVar7);
            if (((pPVar9 == (PClass *)0x0) || (pPVar10 == (PClass *)0x0)) ||
               (bVar5 = PClass::IsAncestorOf(pPVar10,pPVar9), !bVar5)) {
              pcVar13 = FName::NameData.NameArray[(pPVar7->super_PNamedType).TypeName.Index].Text;
              pcVar15 = FName::NameData.NameArray[(this->MethodName).Index].Text;
              message = "Cannot call non-static function %s::%s from here\n";
            }
            else {
              pcVar13 = FName::NameData.NameArray[(pPVar7->super_PNamedType).TypeName.Index].Text;
              pcVar15 = FName::NameData.NameArray[(this->MethodName).Index].Text;
              message = "Qualified member call to parent class %s::%s is not yet implemented\n";
            }
            pFVar8 = (FxExpression *)0x0;
            FScriptPosition::Message(pFVar1,2,message,pcVar13,pcVar15);
            goto LAB_00515d20;
          }
          pFVar8 = (FxExpression *)0x0;
LAB_00515d70:
          this_01 = (FxVMFunctionCall *)
                    FxExpression::operator_new((FxExpression *)0x68,(size_t)pPVar17);
          FxVMFunctionCall::FxVMFunctionCall
                    (this_01,pFVar8,callee,local_48,pFVar1,(bool)((byte)local_4c | (byte)local_50));
          if (this->Self == pFVar8) {
            this->Self = (FxExpression *)0x0;
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          iVar6 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01,ctx);
          return (FxExpression *)CONCAT44(extraout_var_00,iVar6);
        }
        pcVar13 = FName::NameData.NameArray[(this->MethodName).Index].Text;
        pcVar15 = "Unknown function %s\n";
      }
      else {
        pcVar13 = FName::NameData.NameArray[(this->MethodName).Index].Text;
        pcVar15 = "Invalid expression on left hand side of %s\n";
      }
    }
  }
LAB_00515d19:
  pFVar8 = (FxExpression *)0x0;
  FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar15,pcVar13);
  goto LAB_00515d20;
code_r0x005158fb:
  plVar2 = (long *)((long)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array +
                   lVar14);
  lVar14 = lVar14 + 8;
  if (*plVar2 == 0) {
    pFVar8 = (FxExpression *)0x0;
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,"Empty function argument.");
LAB_00515d20:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return pFVar8;
  }
  goto LAB_005158f6;
}

Assistant:

FxExpression *FxMemberFunctionCall::Resolve(FCompileContext& ctx)
{
	ABORT(ctx.Class);
	PStruct *cls;
	bool staticonly = false;
	bool novirtual = false;

	PStruct *ccls = nullptr;

	for (auto a : ArgList)
	{
		if (a == nullptr)
		{
			ScriptPosition.Message(MSG_ERROR, "Empty function argument.");
			delete this;
			return nullptr;
		}
	}

	if (Self->ExprType == EFX_Identifier)
	{
		// If the left side is a class name for a static member function call it needs to be resolved manually 
		// because the resulting value type would cause problems in nearly every other place where identifiers are being used.
		ccls = FindStructType(static_cast<FxIdentifier *>(Self)->Identifier);
		if (ccls != nullptr) static_cast<FxIdentifier *>(Self)->noglobal = true;
	}

	SAFE_RESOLVE(Self, ctx);

	if (Self->ValueType == TypeError)
	{
		if (ccls != nullptr)
		{
			if (!ccls->IsKindOf(RUNTIME_CLASS(PClass)) || static_cast<PClass *>(ccls)->bExported)
			{
				cls = ccls;
				staticonly = true;
				goto isresolved;
			}
		}
	}

	if (Self->ExprType == EFX_Super)
	{
		auto clstype = dyn_cast<PClass>(ctx.Function->Variants[0].SelfClass);
		if (clstype != nullptr)
		{
			// give the node the proper value type now that we know it's properly used.
			cls = clstype->ParentClass;
			Self->ValueType = NewPointer(cls);
			Self->ExprType = EFX_Self;
			novirtual = true;	// super calls are always non-virtual
		}
		else
		{
			ScriptPosition.Message(MSG_ERROR, "Super requires a class type");
		}
	}

	// Note: These builtins would better be relegated to the actual type objects, instead of polluting this file, but that's a task for later.

	// Texture builtins.
	if (Self->ValueType == TypeTextureID)
	{
		if (MethodName == NAME_IsValid || MethodName == NAME_IsNull || MethodName == NAME_Exists || MethodName == NAME_SetInvalid || MethodName == NAME_SetNull)
		{
			if (ArgList.Size() > 0)
			{
				ScriptPosition.Message(MSG_ERROR, "too many parameters in call to %s", MethodName.GetChars());
				delete this;
				return nullptr;
			}
			// No need to create a dedicated node here, all builtins map directly to trivial operations.
			Self->ValueType = TypeSInt32;	// all builtins treat the texture index as integer.
			FxExpression *x;
			switch (MethodName)
			{
			case NAME_IsValid:
				x = new FxCompareRel('>', Self, new FxConstant(0, ScriptPosition));
				break;

			case NAME_IsNull:
				x = new FxCompareEq(TK_Eq, Self, new FxConstant(0, ScriptPosition));
				break;

			case NAME_Exists:
				x = new FxCompareRel(TK_Geq, Self, new FxConstant(0, ScriptPosition));
				break;

			case NAME_SetInvalid:
				x = new FxAssign(Self, new FxConstant(-1, ScriptPosition));
				break;

			case NAME_SetNull:
				x = new FxAssign(Self, new FxConstant(0, ScriptPosition));
				break;
			}
			Self = nullptr;
			SAFE_RESOLVE(x, ctx);
			if (MethodName == NAME_SetInvalid || MethodName == NAME_SetNull) x->ValueType = TypeVoid; // override the default type of the assignment operator.
			delete this;
			return x;
		}
	}

	if (Self->IsVector())
	{
		// handle builtins: Vectors got 2: Length and Unit.
		if (MethodName == NAME_Length || MethodName == NAME_Unit)
		{
			if (ArgList.Size() > 0)
			{
				ScriptPosition.Message(MSG_ERROR, "too many parameters in call to %s", MethodName.GetChars());
				delete this;
				return nullptr;
			}
			auto x = new FxVectorBuiltin(Self, MethodName);
			Self = nullptr;
			delete this;
			return x->Resolve(ctx);
		}
	}

	if (Self->ValueType == TypeString)
	{
		// same for String methods. It also uses a hidden struct type to define them.
		Self->ValueType = TypeStringStruct;
	}

	if (Self->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		auto ptype = static_cast<PPointer *>(Self->ValueType)->PointedType;
		if (ptype->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			if (ptype->IsKindOf(RUNTIME_CLASS(PClass)) && MethodName == NAME_GetClass)
			{
				if (ArgList.Size() > 0)
				{
					ScriptPosition.Message(MSG_ERROR, "too many parameters in call to %s", MethodName.GetChars());
					delete this;
					return nullptr;
				}
				auto x = new FxGetClass(Self);
				return x->Resolve(ctx);
			}
			cls = static_cast<PStruct *>(ptype);
		}
		else
		{
			ScriptPosition.Message(MSG_ERROR, "Left hand side of %s must point to a class object\n", MethodName.GetChars());
			delete this;
			return nullptr;
		}
	}
	else if (Self->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
	{
		bool writable;
		if (Self->RequestAddress(ctx, &writable) && writable)
		{
			cls = static_cast<PStruct*>(Self->ValueType);
			Self->ValueType = NewPointer(Self->ValueType);
		}
		else
		{
			// Cannot be made writable so we cannot use its methods.
			ScriptPosition.Message(MSG_ERROR, "Invalid expression on left hand side of %s\n", MethodName.GetChars());
			delete this;
			return nullptr;
		}
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Invalid expression on left hand side of %s\n", MethodName.GetChars());
		delete this;
		return nullptr;
	}

	// Todo: handle member calls from instantiated structs.

isresolved:
	bool error = false;
	PFunction *afd = FindClassMemberFunction(cls, ctx.Class, MethodName, ScriptPosition, &error);
	if (error)
	{
		delete this;
		return nullptr;
	}

	if (afd == nullptr)
	{
		ScriptPosition.Message(MSG_ERROR, "Unknown function %s\n", MethodName.GetChars());
		delete this;
		return nullptr;
	}

	if (staticonly && (afd->Variants[0].Flags & VARF_Method))
	{
		auto clstype = dyn_cast<PClass>(ctx.Class);
		auto ccls = dyn_cast<PClass>(cls);
		if (clstype == nullptr || ccls == nullptr || !clstype->IsDescendantOf(ccls))
		{
			ScriptPosition.Message(MSG_ERROR, "Cannot call non-static function %s::%s from here\n", cls->TypeName.GetChars(), MethodName.GetChars());
			delete this;
			return nullptr;
		}
		else
		{
			// Todo: If this is a qualified call to a parent class function, let it through (but this needs to disable virtual calls later.)
			ScriptPosition.Message(MSG_ERROR, "Qualified member call to parent class %s::%s is not yet implemented\n", cls->TypeName.GetChars(), MethodName.GetChars());
			delete this;
			return nullptr;
		}
	}

	if (afd->Variants[0].Flags & VARF_Method)
	{
		if (Self->ExprType == EFX_Self)
		{
			if (!CheckFunctionCompatiblity(ScriptPosition, ctx.Function, afd))
			{
				delete this;
				return nullptr;
			}
		}
		else
		{
			// Functions with no Actor usage may not be called through a pointer because they will lose their context.
			if (!(afd->Variants[0].UseFlags & SUF_ACTOR))
			{
				ScriptPosition.Message(MSG_ERROR, "Function %s cannot be used with a non-self object\n", afd->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}

	// do not pass the self pointer to static functions.
	auto self = (afd->Variants[0].Flags & VARF_Method) ? Self : nullptr;
	auto x = new FxVMFunctionCall(self, afd, ArgList, ScriptPosition, staticonly|novirtual);
	if (Self == self) Self = nullptr;
	delete this;
	return x->Resolve(ctx);
}